

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shape.cpp
# Opt level: O0

void __thiscall sf::Shape::draw(Shape *this,RenderTarget *target,RenderStates states)

{
  long in_RDI;
  RenderStates *in_stack_000000b0;
  Drawable *in_stack_000000b8;
  RenderTarget *in_stack_000000c0;
  Transform *in_stack_ffffffffffffffd8;
  Transform *left;
  
  left = (Transform *)&stack0x00000008;
  Transformable::getTransform((Transformable *)states.transform.m_matrix._8_8_);
  operator*=(left,in_stack_ffffffffffffffd8);
  *(undefined8 *)(left[1].m_matrix + 6) = *(undefined8 *)(in_RDI + 0xb8);
  RenderTarget::draw(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
  if ((*(float *)(in_RDI + 0xd8) != 0.0) || (NAN(*(float *)(in_RDI + 0xd8)))) {
    left[1].m_matrix[6] = 0.0;
    left[1].m_matrix[7] = 0.0;
    RenderTarget::draw(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
  }
  return;
}

Assistant:

void Shape::draw(RenderTarget& target, RenderStates states) const
{
    states.transform *= getTransform();

    // Render the inside
    states.texture = m_texture;
    target.draw(m_vertices, states);

    // Render the outline
    if (m_outlineThickness != 0)
    {
        states.texture = NULL;
        target.draw(m_outlineVertices, states);
    }
}